

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_MutateNothingByVisitIdempotent_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_MutateNothingByVisitIdempotent_Test>
             *this)

{
  Test *this_00;
  ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_MutateNothingByVisitIdempotent_Test>
  *this_local;
  
  WithParamInterface<google::protobuf::internal::(anonymous_namespace)::TestParam>::SetParam
            (&this->parameter_);
  this_00 = (Test *)operator_new(0xd0);
  google::protobuf::internal::anon_unknown_0::VisitFieldsTest_MutateNothingByVisitIdempotent_Test::
  VisitFieldsTest_MutateNothingByVisitIdempotent_Test
            ((VisitFieldsTest_MutateNothingByVisitIdempotent_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }